

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virgo.h
# Opt level: O3

ostream * virgo::operator<<(ostream *output,Chessboard *board)

{
  ostream *poVar1;
  long lVar2;
  char cVar3;
  int file;
  long lVar4;
  string grid;
  long *local_58;
  long local_50;
  long local_48 [2];
  ostream *local_38;
  
  local_58 = local_48;
  local_38 = output;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"      A   B   C   D   E   F   G   H  \n","");
  std::__cxx11::string::append((char *)&local_58);
  lVar2 = 0;
  do {
    cVar3 = (char)&local_58;
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::append((char *)&local_58);
    lVar4 = 0;
    do {
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::append((char *)&local_58);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::append((char *)&local_58);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  std::__cxx11::string::append((char *)&local_58);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_38,(char *)local_58,local_50);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return poVar1;
}

Assistant:

inline std::ostream & operator << (std::ostream & output, const Chessboard & board){
        static uint8_t pieceIcons[12] = {'p', 'r', 'n', 'b', 'k', 'q', 'P', 'R', 'N', 'B', 'K', 'Q'};

        std::string grid = "      A   B   C   D   E   F   G   H  \n";
        grid.append("    +---+---+---+---+---+---+---+---+ \n");

        for(int row = 0; row < 8; row++) {
            grid.push_back('8' - row);
            grid.append("   | ");
            for (int file = 0; file < 8; file++) {
                std::pair<Piece, Player> p = board[file + (7-row) * 8];
                if(p.first == EMPTY) grid.push_back(' ');
                else grid.push_back(pieceIcons[p.second * 6 + p.first]);
                grid.append(" | ");
            }
            grid.append("  ");
            grid.push_back('8' - row);
            grid.push_back('\n');
            grid.append("    +---+---+---+---+---+---+---+---+    \n");
        }

        grid.append("      A   B   C   D   E   F   G   H  \n");
        return output << grid;
    }